

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *objToStore,
               XSerializeEngine *serEng)

{
  XMLCh XVar1;
  bool bVar2;
  XMLCh *toWrite;
  ulong __n;
  XMLSize_t XVar3;
  XMLCh *pXVar4;
  void *pvVar5;
  void *extraout_RDX;
  RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *pRVar6;
  int __fd;
  XMLSize_t XVar7;
  RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> local_60;
  
  bVar2 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar2) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    local_60.fMemoryManager = objToStore->fMemoryManager;
    local_60.super_XMLEnumerator<xercesc_4_0::XMLRefInfo>._vptr_XMLEnumerator =
         (_func_int **)&PTR__RefHashTableOfEnumerator_00409230;
    local_60.fAdopted = false;
    local_60.fCurElem = (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0;
    local_60.fCurHash = 0;
    pRVar6 = local_60.fCurElem;
    if (objToStore->fHashModulus != 0) {
      XVar7 = 1;
      do {
        XVar3 = XVar7;
        pRVar6 = objToStore->fBucketList[XVar3 - 1];
        if (objToStore->fBucketList[XVar3 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0) break;
        XVar7 = XVar3 + 1;
        pRVar6 = local_60.fCurElem;
        local_60.fCurHash = XVar3;
      } while (XVar3 != objToStore->fHashModulus);
    }
    local_60.fCurElem = pRVar6;
    XVar7 = 0;
    local_60.fToEnum = objToStore;
    while ((local_60.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0 ||
           (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::nextElement
                (&local_60);
      XVar7 = XVar7 + 1;
    }
    XSerializeEngine::writeSize(serEng,XVar7);
    local_60.fCurElem = (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0;
    local_60.fCurHash = 0;
    pRVar6 = local_60.fCurElem;
    if ((local_60.fToEnum)->fHashModulus != 0) {
      XVar7 = 1;
      do {
        XVar3 = XVar7;
        pRVar6 = (local_60.fToEnum)->fBucketList[XVar3 - 1];
        if ((local_60.fToEnum)->fBucketList[XVar3 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0) break;
        XVar7 = XVar3 + 1;
        pRVar6 = local_60.fCurElem;
        local_60.fCurHash = XVar3;
      } while (XVar3 != (local_60.fToEnum)->fHashModulus);
    }
    local_60.fCurElem = pRVar6;
    while ((local_60.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0 ||
           (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      toWrite = (XMLCh *)RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>
                         ::nextElementKey(&local_60);
      __n = 0;
      XSerializeEngine::writeString(serEng,toWrite,0,false);
      if ((toWrite == (XMLCh *)0x0) || (__n = (ulong)(ushort)*toWrite, __n == 0)) {
        pvVar5 = (void *)0x0;
      }
      else {
        XVar1 = toWrite[1];
        if (XVar1 != L'\0') {
          pXVar4 = toWrite + 2;
          do {
            __n = (ulong)(ushort)XVar1 + (__n >> 0x18) + __n * 0x26;
            XVar1 = *pXVar4;
            pXVar4 = pXVar4 + 1;
          } while (XVar1 != L'\0');
        }
        pvVar5 = (void *)(__n % objToStore->fHashModulus);
      }
      for (pRVar6 = objToStore->fBucketList[(long)pvVar5];
          pRVar6 != (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0; pRVar6 = pRVar6->fNext)
      {
        bVar2 = StringHasher::equals((StringHasher *)&objToStore->field_0x30,toWrite,pRVar6->fKey);
        pvVar5 = extraout_RDX;
        if (bVar2) {
          __fd = (int)pRVar6->fData;
          goto LAB_002cc571;
        }
      }
      __fd = 0;
LAB_002cc571:
      XSerializeEngine::write(serEng,__fd,pvVar5,__n);
    }
    RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_60);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHashTableOf<XMLRefInfo>* const objToStore
                                    , XSerializeEngine&                 serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        RefHashTableOfEnumerator<XMLRefInfo> e(objToStore, false, objToStore->getMemoryManager());
        XMLSize_t itemNumber = 0;

        while (e.hasMoreElements())
        {
            e.nextElement();
            itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

#ifdef XERCES_DEBUG_SORT_GRAMMAR
        //to sort the key
        SORT_KEYSET_ONEKEY(serEng.getMemoryManager())

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            serEng.writeString(strKey);

            XMLRefInfo* data = objToStore->get(strKey);
            serEng<<data;
        }
#else
        while (e.hasMoreElements())
        {
            XMLCh*     key  = (XMLCh*) e.nextElementKey();
            serEng.writeString(key);

            XMLRefInfo* data = objToStore->get(key);
            serEng<<data;
        }
#endif
    }
}